

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::InsideExpression::fromSyntax
          (Compilation *compilation,InsideExpressionSyntax *syntax,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  RangeListSyntax *pRVar2;
  size_t sVar3;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  InsideExpression *expr;
  Expression *pEVar7;
  Diagnostic *this;
  Diagnostic *pDVar8;
  InsideExpression *pIVar9;
  EVP_PKEY_CTX *src;
  long extraout_RDX;
  InsideExpression *args;
  UnaryExpression *unary;
  SourceRange SVar10;
  string_view arg;
  string_view arg_00;
  SourceRange range;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_ffffffffffffff08;
  ExpressionSyntax *elemSyntax;
  __extent_storage<18446744073709551615UL> local_d8;
  pointer local_d0;
  size_type sStack_c8;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SourceRange local_40;
  undefined8 *puVar6;
  
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                firstElement;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len = 0;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.cap = 5;
  pRVar2 = (syntax->ranges).ptr;
  pSVar1 = &pRVar2->valueRanges;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  sVar3 = (pRVar2->valueRanges).elements._M_extent._M_extent_value;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pSVar1;
  for (; ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
          bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != pSVar1 ||
         (bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len != sVar3 + 1 >> 1));
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
           bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
    elemSyntax = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                 iterator_base<slang::syntax::ExpressionSyntax_*>::dereference
                           ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&bound);
    SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
    emplace_back<slang::syntax::ExpressionSyntax_const*const&>
              ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&expressions,&elemSyntax);
  }
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  bound.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  local_d0 = expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_;
  sStack_c8 = expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  expressions_00._M_extent._M_extent_value = (size_t)&bound;
  expressions_00._M_ptr =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
  bVar4 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0xc3,Unknown,true,false,true,
                     SUB81((syntax->expr).ptr,0),
                     (ExpressionSyntax *)
                     expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                     data_,expressions_00,in_stack_ffffffffffffff08);
  iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)compilation,src);
  puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar5);
  args = (InsideExpression *)compilation->logicType;
  pEVar7 = (Expression *)*puVar6;
  local_d8._M_extent_value = extraout_RDX - 1;
  elemSyntax = (ExpressionSyntax *)(puVar6 + 1);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Type *)args,pEVar7,
                    (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&elemSyntax,
                    &local_40);
  if (bVar4) {
    pEVar7 = Expression::unwrapImplicitConversions((Expression *)*puVar6);
    pIVar9 = expr;
    if (pEVar7->kind == UnaryOp) {
      bVar4 = Expression::isParenthesized(pEVar7);
      if ((!bVar4) && (pEVar7[1].kind == HierarchicalValue)) {
        SVar10.startLoc = *(SourceLocation *)&pEVar7[1].type;
        SVar10.endLoc = (SourceLocation)pEVar7[1].constant;
        this = ASTContext::addDiag(context,(DiagCode)0xc80007,SVar10);
        arg._M_str = "\'inside\' expression";
        arg._M_len = 0x13;
        pDVar8 = Diagnostic::operator<<(this,arg);
        SVar10 = parsing::Token::range(&syntax->inside);
        Diagnostic::operator<<(pDVar8,SVar10);
        range.endLoc = (expr->super_Expression).sourceRange.endLoc;
        range.startLoc = (SourceLocation)pEVar7[1].syntax[1].super_SyntaxNode.parent;
        pDVar8 = Diagnostic::addNote(this,(DiagCode)0xb00007,range);
        arg_00._M_str = "\'inside\' expression";
        arg_00._M_len = 0x13;
        Diagnostic::operator<<(pDVar8,arg_00);
        args = (InsideExpression *)&uleb128_00b10007;
        Diagnostic::addNote(this,(DiagCode)0xb10007,pEVar7->sourceRange);
      }
    }
  }
  else {
    pIVar9 = (InsideExpression *)Expression::badExpr(compilation,&expr->super_Expression);
    args = expr;
  }
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
  SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::cleanup
            (&expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>,
             (EVP_PKEY_CTX *)args);
  return &pIVar9->super_Expression;
}

Assistant:

Expression& InsideExpression::fromSyntax(Compilation& compilation,
                                         const InsideExpressionSyntax& syntax,
                                         const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto elemSyntax : syntax.ranges->valueRanges)
        expressions.push_back(elemSyntax);

    SmallVector<const Expression*> bound;
    bool bad =
        !bindMembershipExpressions(context, TokenKind::InsideKeyword, /* requireIntegral */ false,
                                   /* unwrapUnpacked */ true, /* allowTypeReferences */ false,
                                   /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto boundSpan = bound.copy(compilation);
    auto result = compilation.emplace<InsideExpression>(compilation.getLogicType(), *boundSpan[0],
                                                        boundSpan.subspan(1), syntax.sourceRange());
    if (bad)
        return badExpr(compilation, result);

    // Warn about `!x inside {y, z}` where they probably meant `!(x inside {y, z})`
    auto& lhs = boundSpan[0]->unwrapImplicitConversions();
    if (lhs.kind == ExpressionKind::UnaryOp && !lhs.isParenthesized() &&
        lhs.as<UnaryExpression>().op == UnaryOperator::LogicalNot) {

        auto& unary = lhs.as<UnaryExpression>();
        auto kindStr = "'inside' expression"sv;
        auto& diag = context.addDiag(diag::LogicalNotParentheses, unary.opRange);
        diag << kindStr << syntax.inside.range();

        SourceRange range(unary.operand().sourceRange.start(), result->sourceRange.end());
        diag.addNote(diag::NoteLogicalNotFix, range) << kindStr;
        diag.addNote(diag::NoteLogicalNotSilence, lhs.sourceRange);
    }

    return *result;
}